

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper<unsigned_short>::output_bin(ostream *os,remove_const_t<unsigned_short> val)

{
  ostream *poVar1;
  _Setw _Var2;
  streamsize sVar3;
  undefined1 local_132;
  int local_130;
  int i;
  char local_121;
  int iStack_11c;
  char fill;
  int width;
  int len;
  char bits [257];
  remove_const_t<unsigned_short> val_local;
  ostream *os_local;
  
  iStack_11c = 0;
  unique0x1000014d = os;
  for (bits._254_2_ = val; bits._254_2_ != 0 && iStack_11c < 0x100;
      bits._254_2_ = (undefined2)((int)(uint)(ushort)bits._254_2_ >> 1)) {
    local_132 = 0x31;
    if ((bits._254_2_ & 1) == 0) {
      local_132 = 0x30;
    }
    *(undefined1 *)((long)&width + (long)iStack_11c) = local_132;
    iStack_11c = iStack_11c + 1;
  }
  *(undefined1 *)((long)&width + (long)iStack_11c) = 0;
  sVar3 = std::ios_base::width
                    ((ios_base *)
                     (stack0xfffffffffffffff0 + *(long *)(*(long *)stack0xfffffffffffffff0 + -0x18))
                    );
  local_121 = std::ios::fill();
  poVar1 = stack0xfffffffffffffff0;
  if (local_121 == '\0') {
    local_121 = ' ';
  }
  local_130 = iStack_11c;
  if (iStack_11c < (int)sVar3) {
    _Var2 = std::setw((int)sVar3 - iStack_11c);
    std::operator<<(poVar1,_Var2);
    std::operator<<(stack0xfffffffffffffff0,local_121);
  }
  else {
    _Var2 = std::setw(0);
    std::operator<<(poVar1,_Var2);
  }
  while (local_130 = local_130 + -1, -1 < local_130) {
    std::operator<<(stack0xfffffffffffffff0,*(char *)((long)&width + (long)local_130));
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }